

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O3

void Gia_ManAreCubeAddToTree_rec(Gia_ManAre_t *p,Gia_ObjAre_t *pObj,Gia_StaAre_t *pSta)

{
  Gia_PtrAre_t *pGVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint **ppuVar5;
  uint uVar6;
  uint uVar7;
  Gia_PtrAre_t GVar8;
  int iVar9;
  uint *puVar10;
  uint *puVar11;
  
  do {
    uVar4 = *(uint *)pObj;
    uVar7 = *(uint *)(&pSta[1].iPrev.field_0x0 + (uVar4 >> 2 & 0xffc));
    uVar3 = uVar4 * 2 & 0x1e;
    if ((uVar7 >> uVar3 & 1) == 0) {
      if ((uVar7 >> (sbyte)uVar3 & 2) == 0) {
        GVar8 = pObj->F[2];
        if ((0x3ffffff < uVar4) || (((uint)GVar8 & 0x7fffffff) == 0)) {
          pSta->iNext = GVar8;
          uVar2 = (long)p->nStas - 1;
          GVar8 = SUB84(uVar2,0);
          pObj->F[2] = GVar8;
          uVar7 = (uint)(uVar2 >> 0x14) & 0x7ff;
          uVar4 = (uint)GVar8 & 0xfffff;
          if ((Gia_StaAre_t *)(p->ppStas[uVar7] + (long)p->nSize * (ulong)uVar4) == pSta) {
            uVar6 = (*(uint *)pObj >> 0x1a) + 1;
            uVar3 = *(uint *)pObj & 0x3ffffff;
            *(uint *)pObj = uVar6 * 0x4000000 | uVar3;
            if ((~uVar6 & 0x3f) != 0) {
              return;
            }
            ppuVar5 = p->ppStas;
            puVar11 = ppuVar5[uVar7] + (int)(uVar4 * p->nSize);
            if (*ppuVar5 == puVar11) {
              *(uint *)pObj = uVar3;
            }
            else {
              uVar4 = 0;
              do {
                uVar4 = uVar4 - ((int)~*puVar11 >> 0x1f);
                puVar11 = (uint *)((long)(int)((puVar11[1] & 0xfffff) * p->nSize) * 4 +
                                  *(long *)((long)ppuVar5 + (ulong)(puVar11[1] >> 0x11 & 0x3ff8)));
              } while (*ppuVar5 != puVar11);
              *(uint *)pObj = uVar4 * 0x4000000 | uVar3;
              if (0x1e < (uVar4 & 0x3f)) {
                Gia_ManAreRebalance(p,pObj->F + 2);
                pObj->field_0x3 = pObj->field_0x3 & 3;
                return;
              }
            }
            Gia_ManAreCompress(p,pObj->F + 2);
            return;
          }
          goto LAB_00734da1;
        }
      }
      else {
        GVar8 = pObj->F[1];
        if (((uVar4 & 0x3f00000) != 0) || (((uint)GVar8 & 0x7fffffff) == 0)) {
          pSta->iNext = GVar8;
          uVar2 = (long)p->nStas - 1;
          GVar8 = SUB84(uVar2,0);
          pObj->F[1] = GVar8;
          uVar4 = (uint)(uVar2 >> 0x14) & 0x7ff;
          uVar7 = (uint)GVar8 & 0xfffff;
          if ((Gia_StaAre_t *)(p->ppStas[uVar4] + (long)p->nSize * (ulong)uVar7) == pSta) {
            uVar6 = (*(uint *)pObj >> 0x14) + 1 & 0x3f;
            uVar3 = *(uint *)pObj & 0xfc0fffff;
            *(uint *)pObj = uVar6 << 0x14 | uVar3;
            if (uVar6 != 0x3f) {
              return;
            }
            pGVar1 = pObj->F + 1;
            ppuVar5 = p->ppStas;
            puVar11 = ppuVar5[uVar4] + (int)(p->nSize * uVar7);
            if (*ppuVar5 == puVar11) {
              *(uint *)pObj = uVar3;
            }
            else {
              uVar6 = 0;
              do {
                uVar6 = uVar6 - ((int)~*puVar11 >> 0x1f);
                puVar11 = (uint *)((long)(int)((puVar11[1] & 0xfffff) * p->nSize) * 4 +
                                  *(long *)((long)ppuVar5 + (ulong)(puVar11[1] >> 0x11 & 0x3ff8)));
              } while (*ppuVar5 != puVar11);
              *(uint *)pObj = (uVar6 & 0x3f) << 0x14 | uVar3;
              if (0x1e < (uVar6 & 0x3f)) {
                Gia_ManAreRebalance(p,pGVar1);
                *(uint *)pObj = *(uint *)pObj & 0xfc0fffff;
                return;
              }
            }
            if ((uVar2 & 0x7fffffff) != 0) {
              GVar8 = (Gia_PtrAre_t)((uint)GVar8 & 0x80000000);
              *pGVar1 = GVar8;
              ppuVar5 = p->ppStas;
              iVar9 = p->nSize;
              puVar11 = *ppuVar5;
              puVar10 = ppuVar5[uVar4] + (int)(uVar7 * iVar9);
              while (puVar11 != puVar10) {
                uVar4 = puVar10[1];
                if (-1 < (int)*puVar10) {
                  *(Gia_PtrAre_t *)(puVar10 + 1) = GVar8;
                  GVar8 = SUB84(uVar2,0);
                  *pGVar1 = GVar8;
                  ppuVar5 = p->ppStas;
                  iVar9 = p->nSize;
                  puVar11 = *ppuVar5;
                }
                uVar2 = (ulong)uVar4;
                puVar10 = (uint *)((long)(int)((uVar4 & 0xfffff) * iVar9) * 4 +
                                  *(long *)((long)ppuVar5 + (ulong)(uVar4 >> 0x11 & 0x3ff8)));
              }
              return;
            }
            goto LAB_00734dc0;
          }
          goto LAB_00734da1;
        }
      }
    }
    else {
      GVar8 = pObj->F[0];
      if (((uVar4 & 0xfc000) != 0) || (((uint)GVar8 & 0x7fffffff) == 0)) {
        pSta->iNext = GVar8;
        uVar2 = (long)p->nStas - 1;
        GVar8 = SUB84(uVar2,0);
        pObj->F[0] = GVar8;
        uVar4 = (uint)(uVar2 >> 0x14) & 0x7ff;
        uVar7 = (uint)GVar8 & 0xfffff;
        if ((Gia_StaAre_t *)(p->ppStas[uVar4] + (long)p->nSize * (ulong)uVar7) == pSta) {
          uVar6 = (*(uint *)pObj >> 0xe) + 1 & 0x3f;
          uVar3 = *(uint *)pObj & 0xfff03fff;
          *(uint *)pObj = uVar6 << 0xe | uVar3;
          if (uVar6 == 0x3f) {
            pGVar1 = pObj->F;
            ppuVar5 = p->ppStas;
            puVar11 = ppuVar5[uVar4] + (int)(p->nSize * uVar7);
            if (*ppuVar5 == puVar11) {
              *(uint *)pObj = uVar3;
            }
            else {
              uVar6 = 0;
              do {
                uVar6 = uVar6 - ((int)~*puVar11 >> 0x1f);
                puVar11 = (uint *)((long)(int)((puVar11[1] & 0xfffff) * p->nSize) * 4 +
                                  *(long *)((long)ppuVar5 + (ulong)(puVar11[1] >> 0x11 & 0x3ff8)));
              } while (*ppuVar5 != puVar11);
              *(uint *)pObj = (uVar6 & 0x3f) << 0xe | uVar3;
              if (0x1e < (uVar6 & 0x3f)) {
                Gia_ManAreRebalance(p,pGVar1);
                *(uint *)pObj = *(uint *)pObj & 0xfff03fff;
                return;
              }
            }
            if ((uVar2 & 0x7fffffff) == 0) {
LAB_00734dc0:
              __assert_fail("pRoot->nItem || pRoot->nPage",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEra2.c"
                            ,0x3b1,"void Gia_ManAreCompress(Gia_ManAre_t *, Gia_PtrAre_t *)");
            }
            GVar8 = (Gia_PtrAre_t)((uint)GVar8 & 0x80000000);
            *pGVar1 = GVar8;
            ppuVar5 = p->ppStas;
            iVar9 = p->nSize;
            puVar11 = *ppuVar5;
            puVar10 = ppuVar5[uVar4] + (int)(uVar7 * iVar9);
            while (puVar11 != puVar10) {
              uVar4 = puVar10[1];
              if (-1 < (int)*puVar10) {
                *(Gia_PtrAre_t *)(puVar10 + 1) = GVar8;
                GVar8 = SUB84(uVar2,0);
                *pGVar1 = GVar8;
                ppuVar5 = p->ppStas;
                iVar9 = p->nSize;
                puVar11 = *ppuVar5;
              }
              uVar2 = (ulong)uVar4;
              puVar10 = (uint *)((long)(int)((uVar4 & 0xfffff) * iVar9) * 4 +
                                *(long *)((long)ppuVar5 + (ulong)(uVar4 >> 0x11 & 0x3ff8)));
            }
          }
          return;
        }
LAB_00734da1:
        __assert_fail("pSta == Gia_ManAreSta(p, *pRoot)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEra2.c"
                      ,0x415,
                      "void Gia_ManAreCubeAddToList(Gia_ManAre_t *, Gia_PtrAre_t *, Gia_StaAre_t *)"
                     );
      }
    }
    pObj = (Gia_ObjAre_t *)
           ((ulong)(((uint)GVar8 & 0xfffff) << 4) +
           *(long *)((long)p->ppObjs + (ulong)((uint)GVar8 >> 0x11 & 0x3ff8)));
  } while( true );
}

Assistant:

void Gia_ManAreCubeAddToTree_rec( Gia_ManAre_t * p, Gia_ObjAre_t * pObj, Gia_StaAre_t * pSta )
{
    if ( Gia_StaHasValue0(pSta, pObj->iVar) )
    {
        if ( Gia_ObjHasBranch0(pObj) )
            Gia_ManAreCubeAddToTree_rec( p, Gia_ObjNextObj0(p, pObj), pSta );
        else
        {
            Gia_ManAreCubeAddToList( p, pObj->F, pSta );
            if ( ++pObj->nStas0 == MAX_CUBE_NUM )
            {
                pObj->nStas0 = Gia_ManAreListCountListUsed( p, pObj->F[0] );
                if ( pObj->nStas0 < MAX_CUBE_NUM/2 )
                    Gia_ManAreCompress( p, pObj->F );
                else
                {
                    Gia_ManAreRebalance( p, pObj->F );
                    pObj->nStas0 = 0;
                }
            }
        }
    }
    else if ( Gia_StaHasValue1(pSta, pObj->iVar) )
    {
        if ( Gia_ObjHasBranch1(pObj) )
            Gia_ManAreCubeAddToTree_rec( p, Gia_ObjNextObj1(p, pObj), pSta );
        else
        {
            Gia_ManAreCubeAddToList( p, pObj->F+1, pSta );
            if ( ++pObj->nStas1 == MAX_CUBE_NUM )
            {
                pObj->nStas1 = Gia_ManAreListCountListUsed( p, pObj->F[1] );
                if ( pObj->nStas1 < MAX_CUBE_NUM/2 )
                    Gia_ManAreCompress( p, pObj->F+1 );
                else
                {
                    Gia_ManAreRebalance( p, pObj->F+1 );
                    pObj->nStas1 = 0;
                }
            }
        }
    }
    else
    {
        if ( Gia_ObjHasBranch2(pObj) )
            Gia_ManAreCubeAddToTree_rec( p, Gia_ObjNextObj2(p, pObj), pSta );
        else
        {
            Gia_ManAreCubeAddToList( p, pObj->F+2, pSta );
            if ( ++pObj->nStas2 == MAX_CUBE_NUM )
            {
                pObj->nStas2 = Gia_ManAreListCountListUsed( p, pObj->F[2] );
                if ( pObj->nStas2 < MAX_CUBE_NUM/2 )
                    Gia_ManAreCompress( p, pObj->F+2 );
                else
                {
                    Gia_ManAreRebalance( p, pObj->F+2 );
                    pObj->nStas2 = 0;
                }
            }
        }
    }
}